

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O0

_Bool al_set_audio_stream_gain(ALLEGRO_AUDIO_STREAM *stream,float val)

{
  long in_RDI;
  float in_XMM0_Da;
  ALLEGRO_MUTEX *stream_mutex;
  ALLEGRO_MIXER *mixer;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var1;
  
  if ((*(long *)(in_RDI + 0xf8) == 0) || ((*(byte *)(in_RDI + 0x100) & 1) == 0)) {
    if (((*(float *)(in_RDI + 0xb4) != in_XMM0_Da) ||
        (NAN(*(float *)(in_RDI + 0xb4)) || NAN(in_XMM0_Da))) &&
       (*(float *)(in_RDI + 0xb4) = in_XMM0_Da, *(long *)(in_RDI + 0xf8) != 0)) {
      maybe_lock_mutex((ALLEGRO_MUTEX *)0x110880);
      _al_kcm_mixer_rejig_sample_matrix
                ((ALLEGRO_MIXER *)stream_mutex,
                 (ALLEGRO_SAMPLE_INSTANCE *)
                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      maybe_unlock_mutex((ALLEGRO_MUTEX *)0x11089c);
    }
    _Var1 = true;
  }
  else {
    _al_set_error((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),in_stack_ffffffffffffffd8);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool al_set_audio_stream_gain(ALLEGRO_AUDIO_STREAM *stream, float val)
{
   ASSERT(stream);

   if (stream->spl.parent.u.ptr && stream->spl.parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set gain of stream attached to voice");
      return false;
   }

   if (stream->spl.gain != val) {
      stream->spl.gain = val;

      /* If attached to a mixer already, need to recompute the sample
       * matrix to take into account the gain.
       */
      if (stream->spl.parent.u.mixer) {
         ALLEGRO_MIXER *mixer = stream->spl.parent.u.mixer;
         ALLEGRO_MUTEX *stream_mutex = maybe_lock_mutex(stream->spl.mutex);
         _al_kcm_mixer_rejig_sample_matrix(mixer, &stream->spl);
         maybe_unlock_mutex(stream_mutex);
      }
   }

   return true;
}